

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndTabBar(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiPtrOrIndex *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiTabBar *pIVar5;
  float fVar6;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->SkipItems == false) && (pIVar5 = GImGui->CurrentTabBar, pIVar5 != (ImGuiTabBar *)0x0)
     ) {
    if (pIVar5->WantLayout == true) {
      TabBarLayout(pIVar5);
    }
    if (((pIVar5->VisibleTabWasSubmitted == false) && (pIVar5->VisibleTabId != 0)) &&
       (pIVar4->FrameCount <= pIVar5->PrevFrameVisible + 1)) {
      (pIVar2->DC).CursorPos.y = (pIVar5->BarRect).Max.y + pIVar5->LastTabContentHeight;
    }
    else {
      fVar6 = (pIVar2->DC).CursorPos.y - (pIVar5->BarRect).Max.y;
      pIVar5->LastTabContentHeight = (float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
    }
    if ((pIVar5->Flags & 0x100000) == 0) {
      PopID();
    }
    iVar1 = (pIVar4->CurrentTabBarStack).Size;
    (pIVar4->CurrentTabBarStack).Size = iVar1 + -1;
    if (iVar1 + -1 == 0) {
      pIVar5 = (ImGuiTabBar *)0x0;
    }
    else {
      pIVar3 = (pIVar4->CurrentTabBarStack).Data;
      pIVar5 = (ImGuiTabBar *)pIVar3[(long)iVar1 + -2].Ptr;
      if (pIVar5 == (ImGuiTabBar *)0x0) {
        pIVar5 = (GImGui->TabBars).Buf.Data + pIVar3[(long)iVar1 + -2].Index;
      }
    }
    pIVar4->CurrentTabBar = pIVar5;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
        tab_bar->LastTabContentHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, 0.0f);
    else
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->LastTabContentHeight;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}